

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCurtainWallType::IfcCurtainWallType(IfcCurtainWallType *this)

{
  IfcCurtainWallType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcCurtainWallType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__00e7c620);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurtainWallType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurtainWallType,_1UL>,
             &PTR_construction_vtable_24__00e7c758);
  *(undefined8 *)this = 0xe7c4f0;
  *(undefined8 *)&this->field_0x1c0 = 0xe7c608;
  *(undefined8 *)&this->field_0x88 = 0xe7c518;
  *(undefined8 *)&this->field_0x98 = 0xe7c540;
  *(undefined8 *)&this->field_0xf0 = 0xe7c568;
  *(undefined8 *)&this->field_0x148 = 0xe7c590;
  *(undefined8 *)&this->field_0x180 = 0xe7c5b8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurtainWallType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xe7c5e0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurtainWallType,_1UL>).
              field_0x10);
  return;
}

Assistant:

IfcCurtainWallType() : Object("IfcCurtainWallType") {}